

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O3

void anon_unknown.dwarf_22b6e::testScanLineImage(Box2i *dataWindow,string *fileName)

{
  ostream *poVar1;
  Rand48 random;
  DeepImage img2;
  DeepImage img1;
  Rand48 local_f6;
  long *local_f0 [2];
  long local_e0 [11];
  DeepImage local_88 [104];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"scan lines, data window = (",0x1b);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(dataWindow->min).x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(dataWindow->min).y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") - (",5);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(dataWindow->max).x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(dataWindow->max).y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  Imf_3_2::DeepImage::DeepImage(local_88);
  Imf_3_2::Image::resize((Box *)local_88);
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"H1","");
  Imf_3_2::Image::insertChannel((string *)local_88,(PixelType)local_f0,1,1,true);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"H2","");
  Imf_3_2::Image::insertChannel((string *)local_88,(PixelType)local_f0,1,1,true);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"F","");
  Imf_3_2::Image::insertChannel((string *)local_88,(PixelType)local_f0,2,1,true);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"UI","");
  Imf_3_2::Image::insertChannel((string *)local_88,(PixelType)local_f0,0,1,true);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  local_f6._state[0] = 0x5a5a;
  local_f6._state[1] = 0x5a5a;
  local_f6._state[2] = 0x5a5a;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    generating random pixel values",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  fillChannels(&local_f6,local_88);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    saving file",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  Imf_3_2::saveDeepScanLineImage((string *)fileName,local_88);
  Imf_3_2::DeepImage::DeepImage((DeepImage *)local_f0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    loading file",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  Imf_3_2::loadDeepImage((string *)fileName,(DeepImage *)local_f0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    comparing",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  verifyImagesAreEqual(local_88,(DeepImage *)local_f0,0,0);
  remove((fileName->_M_dataplus)._M_p);
  Imf_3_2::DeepImage::~DeepImage((DeepImage *)local_f0);
  Imf_3_2::DeepImage::~DeepImage(local_88);
  return;
}

Assistant:

void
testScanLineImage (const Box2i& dataWindow, const string& fileName)
{
    cout << "scan lines, data window = "
            "("
         << dataWindow.min.x << ", " << dataWindow.min.y
         << ") - "
            "("
         << dataWindow.max.x << ", " << dataWindow.max.y << ")" << endl;

    FlatImage img1;
    img1.resize (dataWindow);

    img1.insertChannel ("H11", HALF, 1, 1, false);
    img1.insertChannel ("H22", HALF, 2, 2, true);
    img1.insertChannel ("H12", HALF, 1, 2, true);
    img1.insertChannel ("H21", HALF, 2, 1, true);
    img1.insertChannel ("F", FLOAT, 1, 1, false);
    img1.insertChannel ("UI", UINT, 1, 1, false);

    Rand48 random (0);
    cout << "    generating random pixel values" << endl;
    fillChannels (random, img1);

    cout << "    saving file" << endl;
    saveFlatScanLineImage (fileName, img1);

    FlatImage img2;

    cout << "    loading file" << endl;
    loadFlatImage (fileName, img2);

    cout << "    comparing" << endl;
    verifyImagesAreEqual (img1, img2);

    remove (fileName.c_str ());
}